

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O3

int adios2::core::engine::sqlcb_bpdataset(void *p,int argc,char **argv,char **azColName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  double dVar6;
  size_t dsid;
  CampaignBPDataset cds;
  allocator local_f1;
  string local_f0;
  string local_d0;
  size_t local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  char *local_80;
  undefined1 local_78 [16];
  size_t local_68;
  size_t sStack_60;
  bool local_58;
  undefined7 uStack_57;
  size_t sStack_50;
  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  local_48;
  
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  local_88 = local_78;
  local_80 = (char *)0x0;
  local_78[0] = 0;
  local_48.
  super__Vector_base<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_f0,*argv,&local_f1);
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"SQL callback convert text to int","");
  sVar3 = helper::StringToSizeT(&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_b0 = sVar3;
  std::__cxx11::string::string((string *)&local_f0,argv[1],&local_f1);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"SQL callback convert text to int","");
  sVar3 = helper::StringToSizeT(&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_f0,argv[2],&local_f1);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"SQL callback convert text to int","");
  sVar4 = helper::StringToSizeT(&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pcVar2 = local_80;
  local_68 = sVar3 - 1;
  sStack_60 = sVar4 - 1;
  __s = argv[3];
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_88,0,pcVar2,(ulong)__s);
  local_58 = false;
  sStack_50 = 0;
  dVar6 = *(double *)((long)p + 0x30);
  if (0.2 <= dVar6) {
    std::__cxx11::string::string((string *)&local_f0,argv[4],&local_f1);
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"SQL callback convert text to int","");
    sVar3 = helper::StringToSizeT(&local_f0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_58 = sVar3 != 0;
    sStack_50 = sVar3 - 1;
    dVar6 = *(double *)((long)p + 0x30);
  }
  if (0.3 <= dVar6) {
    std::__cxx11::string::string((string *)&local_f0,argv[5],(allocator *)&local_d0);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  pmVar5 = std::
           map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
           ::operator[]((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
                         *)((long)p + 0x80),&local_b0);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::_M_assign((string *)&pmVar5->name);
  *(ulong *)&pmVar5->hasKey = CONCAT71(uStack_57,local_58);
  pmVar5->keyIdx = sStack_50;
  pmVar5->hostIdx = local_68;
  pmVar5->dirIdx = sStack_60;
  std::
  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  ::operator=(&pmVar5->files,&local_48);
  std::
  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  ::~vector(&local_48);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return 0;
}

Assistant:

static int sqlcb_bpdataset(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    CampaignBPDataset cds;
    size_t dsid = helper::StringToSizeT(std::string(argv[0]), "SQL callback convert text to int");
    size_t hostid = helper::StringToSizeT(std::string(argv[1]), "SQL callback convert text to int");
    size_t dirid = helper::StringToSizeT(std::string(argv[2]), "SQL callback convert text to int");
    cds.hostIdx = hostid - 1; // SQL rows start from 1, vector idx start from 0
    cds.dirIdx = dirid - 1;   // SQL rows start from 1, vector idx start from 0
    cds.name = argv[3];

    cds.hasKey = false;
    cds.keyIdx = 0;
    if (cdp->version.version >= 0.2)
    {
        size_t keyid =
            helper::StringToSizeT(std::string(argv[4]), "SQL callback convert text to int");
        cds.hasKey = (keyid); // keyid == 0 means there is no key used
        cds.keyIdx = size_t(keyid - 1);
    }
    if (cdp->version.version >= 0.3)
    {
        cds.uuid = std::string(argv[5]);
    }
    cdp->bpdatasets[dsid] = cds;
    return 0;
}